

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

void refreshMultiLine(linenoiseState *l,int flags)

{
  int __fd;
  ulong uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  void *__buf;
  size_t __n;
  uint in_ESI;
  long in_RDI;
  uint i;
  string ab;
  int j;
  int fd;
  int old_rows;
  int col;
  int rpos2;
  int rpos;
  int rows;
  int colpos2;
  int colpos;
  size_t pcollen;
  char seq [64];
  size_t in_stack_00000f18;
  char *in_stack_00000f20;
  size_t in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  char *buf;
  uint local_b8;
  string local_a8 [12];
  int in_stack_ffffffffffffff64;
  linenoiseState *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  int local_84;
  int local_6c;
  char local_58 [76];
  uint local_c;
  long local_8;
  
  buf = *(char **)(in_RDI + 0x28);
  local_c = in_ESI;
  local_8 = in_RDI;
  strlen(*(char **)(in_RDI + 0x28));
  sVar4 = promptTextColumnLen(in_stack_00000f20,in_stack_00000f18);
  sVar5 = columnPosForMultiLine
                    (buf,(size_t)in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30,
                     (size_t)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  local_6c = (int)(((sVar4 + (long)(int)sVar5 + *(long *)(local_8 + 0x50)) - 1) /
                  *(ulong *)(local_8 + 0x50));
  iVar2 = (int)((sVar4 + *(long *)(local_8 + 0x40) + *(long *)(local_8 + 0x50)) /
               *(ulong *)(local_8 + 0x50));
  iVar3 = (int)*(undefined8 *)(local_8 + 0x58);
  __fd = *(int *)(local_8 + 0x14);
  std::__cxx11::string::string(local_a8);
  *(long *)(local_8 + 0x58) = (long)local_6c;
  if ((local_c & 1) != 0) {
    if (0 < iVar3 - iVar2) {
      in_stack_ffffffffffffff38 = local_58;
      snprintf(in_stack_ffffffffffffff38,0x40,"\x1b[%dB",(ulong)(uint)(iVar3 - iVar2));
      std::__cxx11::string::append((char *)local_a8);
    }
    for (local_84 = 0; local_84 < iVar3 + -1; local_84 = local_84 + 1) {
      in_stack_ffffffffffffff30 = local_58;
      snprintf(in_stack_ffffffffffffff30,0x40,"\r\x1b[0K\x1b[1A");
      std::__cxx11::string::append((char *)local_a8);
    }
  }
  if ((local_c & 3) != 0) {
    in_stack_ffffffffffffff28 = local_58;
    snprintf(in_stack_ffffffffffffff28,0x40,"\r\x1b[0K");
    std::__cxx11::string::append((char *)local_a8);
  }
  sVar5 = columnPosForMultiLine
                    (buf,(size_t)in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30,
                     (size_t)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  iVar2 = (int)sVar5;
  if ((local_c & 2) != 0) {
    std::__cxx11::string::append((char *)local_a8);
    if (maskmode == 1) {
      for (local_b8 = 0; (ulong)local_b8 < *(ulong *)(local_8 + 0x48); local_b8 = local_b8 + 1) {
        std::__cxx11::string::append((char *)local_a8);
      }
    }
    else {
      std::__cxx11::string::append((char *)local_a8,*(ulong *)(local_8 + 0x18));
    }
    refreshShowHints(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    if (((*(long *)(local_8 + 0x38) != 0) &&
        (*(long *)(local_8 + 0x38) == *(long *)(local_8 + 0x48))) &&
       (((long)iVar2 + sVar4) % *(ulong *)(local_8 + 0x50) == 0)) {
      std::__cxx11::string::append((char *)local_a8);
      snprintf(local_58,0x40,"\r");
      std::__cxx11::string::append((char *)local_a8);
      local_6c = local_6c + 1;
      if ((int)*(undefined8 *)(local_8 + 0x58) < local_6c) {
        *(long *)(local_8 + 0x58) = (long)local_6c;
      }
    }
    iVar3 = (int)((sVar4 + (long)iVar2 + *(long *)(local_8 + 0x50)) / *(ulong *)(local_8 + 0x50));
    if (0 < local_6c - iVar3) {
      snprintf(local_58,0x40,"\x1b[%dA",(ulong)(uint)(local_6c - iVar3));
      std::__cxx11::string::append((char *)local_a8);
    }
    uVar1 = (sVar4 + (long)iVar2) % *(ulong *)(local_8 + 0x50);
    if ((int)uVar1 == 0) {
      snprintf(local_58,0x40,"\r");
    }
    else {
      snprintf(local_58,0x40,"\r\x1b[%dC",uVar1 & 0xffffffff);
    }
    std::__cxx11::string::append((char *)local_a8);
  }
  *(long *)(local_8 + 0x40) = (long)iVar2;
  __buf = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::size();
  write(__fd,__buf,__n);
  std::__cxx11::string::~string(local_a8);
  return;
}

Assistant:

static void refreshMultiLine(struct linenoiseState *l, int flags) {
    char seq[64];
    size_t      pcollen = promptTextColumnLen(l->prompt, strlen(l->prompt));
    int         colpos  = columnPosForMultiLine(l->buf, l->len, l->len, l->cols, pcollen);
    int         colpos2;                                             /* cursor column position. */
    int         rows = (pcollen + colpos + l->cols - 1) / l->cols;   /* rows used by current buf. */
    int         rpos = (pcollen + l->oldcolpos + l->cols) / l->cols; /* cursor relative row. */
    int rpos2; /* rpos after refresh. */
    int         col;   /* column position, zero-based. */
    int old_rows = l->oldrows;
    int fd = l->ofd, j;
    std::string ab;
    l->oldrows = rows;

    /* First step: clear all the lines used before. To do so start by
     * going to the last row. */
    if (flags & REFRESH_CLEAN) {
        if (old_rows - rpos > 0) {
            snprintf(seq,64,"\x1b[%dB", old_rows-rpos);
            ab.append(seq);
        }

        /* Now for every row clear it, go up. */
        for (j = 0; j < old_rows - 1; j++) {
            snprintf(seq,64,"\r\x1b[0K\x1b[1A");
            ab.append(seq);
        }
    }

    if (flags & REFRESH_ALL) {
        /* Clean the top line. */
        snprintf(seq,64,"\r\x1b[0K");
        ab.append(seq);
    }

    /* Get column length to cursor position */
    colpos2 = columnPosForMultiLine(l->buf, l->len, l->pos, l->cols, pcollen);

    if (flags & REFRESH_WRITE) {
        /* Write the prompt and the current buffer content */
        ab.append(l->prompt);
        if (maskmode == 1) {
            for (unsigned int i = 0; i < l->len; ++i) {
                ab.append("*");
            }
        } else {
            ab.append(l->buf, l->len);
        }

        /* Show hits if any. */
        refreshShowHints(ab, l, pcollen);

        /* If we are at the very end of the screen with our prompt, we need to
         * emit a newline and move the prompt to the first column. */
        if (l->pos && l->pos == l->len && (colpos2 + pcollen) % l->cols == 0) {
            ab.append("\n");
            snprintf(seq,64,"\r");
            ab.append(seq);
            rows++;
            if (rows > (int)l->oldrows) l->oldrows = rows;
        }

        /* Move cursor to right position. */
        rpos2 = (pcollen + colpos2 + l->cols) / l->cols; /* Current cursor relative row */

        /* Go up till we reach the expected position. */
        if (rows - rpos2 > 0) {
            snprintf(seq,64,"\x1b[%dA", rows-rpos2);
            ab.append(seq);
        }

        /* Set column. */
        col = (pcollen + colpos2) % l->cols;
        if (col)
            snprintf(seq,64,"\r\x1b[%dC", col);
        else
            snprintf(seq,64,"\r");
        ab.append(seq);
    }

    l->oldcolpos = colpos2;

    (void) !write(fd, ab.c_str(), ab.size()); /* Can't recover from write error. */
}